

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTarget::GetAutoUicOptions
          (cmTarget *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *result,string *config)

{
  cmMakefile *mf;
  char *pcVar1;
  string *target;
  cmCompiledGeneratorExpression *this_00;
  allocator local_191;
  string local_190;
  cmGeneratorExpression local_170;
  string local_168;
  allocator local_141;
  string local_140;
  undefined1 local_120 [8];
  cmGeneratorExpressionDAGChecker dagChecker;
  cmGeneratorExpression ge;
  allocator local_49;
  string local_48;
  char *local_28;
  char *prop;
  string *config_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result_local;
  cmTarget *this_local;
  
  prop = (char *)config;
  config_local = (string *)result;
  result_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"AUTOUIC_OPTIONS",&local_49);
  pcVar1 = GetLinkInterfaceDependentStringProperty(this,&local_48,(string *)prop);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (pcVar1 != (char *)0x0) {
    local_28 = pcVar1;
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)&dagChecker.CheckResult,(cmListFileBacktrace *)0x0);
    target = GetName_abi_cxx11_(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_140,"AUTOUIC_OPTIONS",&local_141);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)local_120,target,&local_140,
               (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
    cmGeneratorExpression::Parse(&local_170,(char *)&dagChecker.CheckResult);
    this_00 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->
                        ((auto_ptr<cmCompiledGeneratorExpression> *)&local_170);
    pcVar1 = prop;
    mf = this->Makefile;
    std::__cxx11::string::string((string *)&local_190);
    pcVar1 = cmCompiledGeneratorExpression::Evaluate
                       (this_00,mf,(string *)pcVar1,false,this,
                        (cmGeneratorExpressionDAGChecker *)local_120,&local_190);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_168,pcVar1,&local_191);
    cmSystemTools::ExpandListArgument
              (&local_168,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)config_local,false);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_191);
    std::__cxx11::string::~string((string *)&local_190);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&local_170);
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)local_120);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&dagChecker.CheckResult);
  }
  return;
}

Assistant:

void cmTarget::GetAutoUicOptions(std::vector<std::string> &result,
                                 const std::string& config) const
{
  const char *prop
            = this->GetLinkInterfaceDependentStringProperty("AUTOUIC_OPTIONS",
                                                            config);
  if (!prop)
    {
    return;
    }
  cmGeneratorExpression ge;

  cmGeneratorExpressionDAGChecker dagChecker(
                                      this->GetName(),
                                      "AUTOUIC_OPTIONS", 0, 0);
  cmSystemTools::ExpandListArgument(ge.Parse(prop)
                                      ->Evaluate(this->Makefile,
                                                config,
                                                false,
                                                this,
                                                &dagChecker),
                                  result);
}